

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut_set.hpp
# Opt level: O1

size_t __thiscall
cappuccino::
ut_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
::do_prune(ut_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
           *this,time_point now)

{
  list<cappuccino::ut_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::ttl_element,_std::allocator<cappuccino::ut_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::ttl_element>_>
  *this_00;
  const_iterator __first;
  const_iterator cVar1;
  size_t sVar2;
  
  this_00 = &this->m_ttl_list;
  __first._M_node =
       (this->m_ttl_list).
       super__List_base<cappuccino::ut_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::ttl_element,_std::allocator<cappuccino::ut_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::ttl_element>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  cVar1._M_node = __first._M_node;
  if (__first._M_node == (_List_node_base *)this_00) {
    sVar2 = 0;
  }
  else {
    sVar2 = 0;
    do {
      if ((long)now.__d.__r < (long)cVar1._M_node[1]._M_next) break;
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cappuccino::ut_set<std::__cxx11::string,(cappuccino::thread_safe)1>::keyed_element>,std::_Select1st<std::pair<std::__cxx11::string_const,cappuccino::ut_set<std::__cxx11::string,(cappuccino::thread_safe)1>::keyed_element>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cappuccino::ut_set<std::__cxx11::string,(cappuccino::thread_safe)1>::keyed_element>>>
      ::erase_abi_cxx11_((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cappuccino::ut_set<std::__cxx11::string,(cappuccino::thread_safe)1>::keyed_element>,std::_Select1st<std::pair<std::__cxx11::string_const,cappuccino::ut_set<std::__cxx11::string,(cappuccino::thread_safe)1>::keyed_element>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cappuccino::ut_set<std::__cxx11::string,(cappuccino::thread_safe)1>::keyed_element>>>
                          *)&this->m_keyed_elements,(_Base_ptr)cVar1._M_node[1]._M_prev);
      sVar2 = sVar2 + 1;
      cVar1._M_node = (cVar1._M_node)->_M_next;
    } while (cVar1._M_node != (_List_node_base *)this_00);
  }
  if (cVar1._M_node != __first._M_node) {
    std::__cxx11::
    list<cappuccino::ut_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::ttl_element,_std::allocator<cappuccino::ut_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::ttl_element>_>
    ::erase(this_00,__first,cVar1);
  }
  return sVar2;
}

Assistant:

auto do_prune(std::chrono::steady_clock::time_point now) -> size_t
    {
        const auto   ttl_begin = m_ttl_list.begin();
        const auto   ttl_end   = m_ttl_list.end();
        ttl_iterator ttl_iter;
        size_t       deleted{0};

        // Delete the keyed elements from the set. Not using do_erase to take
        // advantage of iterator range delete for TTLs.
        for (ttl_iter = ttl_begin; ttl_iter != ttl_end && now >= ttl_iter->m_expire_time; ++ttl_iter)
        {
            m_keyed_elements.erase(ttl_iter->m_keyed_elements_position);
            ++deleted;
        }

        // Delete the range of TTLs.
        if (ttl_iter != ttl_begin)
        {
            m_ttl_list.erase(ttl_begin, ttl_iter);
        }

        return deleted;
    }